

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateDefinition
          (EnumGenerator *this,Printer *printer)

{
  Options *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Syntax SVar5;
  EnumValueDescriptor *pEVar6;
  Options *pOVar7;
  EnumValueDescriptor *pEVar8;
  FileDescriptor *pFVar9;
  int number;
  EnumValueDescriptor *enum_value;
  EnumValueDescriptor *enum_value_00;
  EnumValueDescriptor *enum_value_01;
  string local_1d0;
  string local_1b0;
  EnumValueDescriptor *local_190;
  string local_188;
  allocator local_161;
  string local_160;
  string local_140;
  allocator local_119;
  string local_118;
  string local_f8;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  Formatter format_value;
  EnumValueDescriptor *pEStack_70;
  int i;
  EnumValueDescriptor *max_value;
  EnumValueDescriptor *min_value;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  Formatter::operator()
            ((Formatter *)local_50,"enum ${1$$classname$$}$ : int {\n",&this->descriptor_);
  Formatter::Indent((Formatter *)local_50);
  max_value = EnumDescriptor::value(this->descriptor_,0);
  pEStack_70 = EnumDescriptor::value(this->descriptor_,0);
  format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  while( true ) {
    iVar3 = format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    uVar2 = EnumDescriptor::value_count(this->descriptor_);
    pEVar8 = (EnumValueDescriptor *)(ulong)uVar2;
    if ((int)uVar2 <= iVar3) break;
    Formatter::Formatter((Formatter *)local_b0,(Formatter *)local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"name",&local_d1);
    pEVar6 = EnumDescriptor::value
                       (this->descriptor_,
                        format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    EnumValueName_abi_cxx11_(&local_f8,(cpp *)pEVar6,enum_value);
    Formatter::Set<std::__cxx11::string>((Formatter *)local_b0,&local_d0,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,"number",&local_119);
    pEVar6 = EnumDescriptor::value
                       (this->descriptor_,
                        format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    uVar2 = EnumValueDescriptor::number(pEVar6);
    Int32ToString_abi_cxx11_(&local_140,(cpp *)(ulong)uVar2,number);
    Formatter::Set<std::__cxx11::string>((Formatter *)local_b0,&local_118,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_160,"deprecation",&local_161);
    this_00 = this->options_;
    pOVar7 = (Options *)
             EnumDescriptor::value
                       (this->descriptor_,
                        format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    DeprecatedAttribute_abi_cxx11_(&local_188,(cpp *)this_00,pOVar7,pEVar8);
    Formatter::Set<std::__cxx11::string>((Formatter *)local_b0,&local_160,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    if (0 < format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
      Formatter::operator()<>((Formatter *)local_b0,",\n");
    }
    local_190 = EnumDescriptor::value
                          (this->descriptor_,
                           format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
                          );
    Formatter::operator()
              ((Formatter *)local_b0,"${1$$prefix$$name$$}$ $deprecation$= $number$",&local_190);
    pEVar8 = EnumDescriptor::value
                       (this->descriptor_,
                        format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    iVar3 = EnumValueDescriptor::number(pEVar8);
    iVar4 = EnumValueDescriptor::number(max_value);
    if (iVar3 < iVar4) {
      max_value = EnumDescriptor::value
                            (this->descriptor_,
                             format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count.
                             _4_4_);
    }
    pEVar8 = EnumDescriptor::value
                       (this->descriptor_,
                        format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    iVar3 = EnumValueDescriptor::number(pEVar8);
    iVar4 = EnumValueDescriptor::number(pEStack_70);
    if (iVar4 < iVar3) {
      pEStack_70 = EnumDescriptor::value
                             (this->descriptor_,
                              format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count.
                              _4_4_);
    }
    Formatter::~Formatter((Formatter *)local_b0);
    format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         format_value.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
  }
  pFVar9 = EnumDescriptor::file(this->descriptor_);
  SVar5 = FileDescriptor::syntax(pFVar9);
  if (SVar5 == SYNTAX_PROTO3) {
    iVar3 = EnumDescriptor::value_count(this->descriptor_);
    if (0 < iVar3) {
      Formatter::operator()<>((Formatter *)local_50,",\n");
    }
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = std::numeric_limits<$int32$>::min(),\n$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = std::numeric_limits<$int32$>::max()"
              );
  }
  Formatter::Outdent((Formatter *)local_50);
  Formatter::operator()<>((Formatter *)local_50,"\n};\n");
  EnumValueName_abi_cxx11_(&local_1b0,(cpp *)max_value,enum_value_00);
  EnumValueName_abi_cxx11_(&local_1d0,(cpp *)pEStack_70,enum_value_01);
  Formatter::operator()
            ((Formatter *)local_50,
             "$dllexport_decl $bool $classname$_IsValid(int value);\nconstexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = $prefix$$2$;\nconstexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = $prefix$$3$;\n"
             ,&this->descriptor_,&local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  if ((this->generate_array_size_ & 1U) != 0) {
    Formatter::operator()
              ((Formatter *)local_50,
               "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = $prefix$$short_name$_MAX + 1;\n\n"
               ,&this->descriptor_);
  }
  pFVar9 = EnumDescriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(pFVar9,this->options_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* $classname$_descriptor();\n");
  }
  pFVar9 = EnumDescriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(pFVar9,this->options_);
  if (!bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,"const std::string& $classname$_Name($classname$ value);\n");
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "template<typename T>\ninline const std::string& $classname$_Name(T enum_t_value) {\n  static_assert(::std::is_same<T, $classname$>::value ||\n    ::std::is_integral<T>::value,\n    \"Incorrect type passed to function $classname$_Name.\");\n"
            );
  pFVar9 = EnumDescriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(pFVar9,this->options_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "  return ::$proto_ns$::internal::NameOfEnum(\n    $classname$_descriptor(), enum_t_value);\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n");
  }
  Formatter::operator()<>((Formatter *)local_50,"}\n");
  pFVar9 = EnumDescriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(pFVar9,this->options_);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "inline bool $classname$_Parse(\n    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* value) {\n  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n    $classname$_descriptor(), name, value);\n}\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "bool $classname$_Parse(\n    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* value);\n"
              );
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void EnumGenerator::GenerateDefinition(io::Printer* printer) {
  Formatter format(printer, variables_);
  format("enum ${1$$classname$$}$ : int {\n", descriptor_);
  format.Indent();

  const EnumValueDescriptor* min_value = descriptor_->value(0);
  const EnumValueDescriptor* max_value = descriptor_->value(0);

  for (int i = 0; i < descriptor_->value_count(); i++) {
    auto format_value = format;
    format_value.Set("name", EnumValueName(descriptor_->value(i)));
    // In C++, an value of -2147483648 gets interpreted as the negative of
    // 2147483648, and since 2147483648 can't fit in an integer, this produces a
    // compiler warning.  This works around that issue.
    format_value.Set("number", Int32ToString(descriptor_->value(i)->number()));
    format_value.Set("deprecation",
                     DeprecatedAttribute(options_, descriptor_->value(i)));

    if (i > 0) format_value(",\n");
    format_value("${1$$prefix$$name$$}$ $deprecation$= $number$",
                 descriptor_->value(i));

    if (descriptor_->value(i)->number() < min_value->number()) {
      min_value = descriptor_->value(i);
    }
    if (descriptor_->value(i)->number() > max_value->number()) {
      max_value = descriptor_->value(i);
    }
  }

  if (descriptor_->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    // For new enum semantics: generate min and max sentinel values equal to
    // INT32_MIN and INT32_MAX
    if (descriptor_->value_count() > 0) format(",\n");
    format(
        "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::min(),\n"
        "$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::max()");
  }

  format.Outdent();
  format("\n};\n");

  format(
      "$dllexport_decl $bool $classname$_IsValid(int value);\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = "
      "$prefix$$2$;\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = "
      "$prefix$$3$;\n",
      descriptor_, EnumValueName(min_value), EnumValueName(max_value));

  if (generate_array_size_) {
    format(
        "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = "
        "$prefix$$short_name$_MAX + 1;\n\n",
        descriptor_);
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* "
        "$classname$_descriptor();\n");
  }

  // The _Name and _Parse functions. The lite implementation is table-based, so
  // we make sure to keep the tables hidden in the .cc file.
  if (!HasDescriptorMethods(descriptor_->file(), options_)) {
    format("const std::string& $classname$_Name($classname$ value);\n");
  }
  // The _Name() function accepts the enum type itself but also any integral
  // type.
  format(
      "template<typename T>\n"
      "inline const std::string& $classname$_Name(T enum_t_value) {\n"
      "  static_assert(::std::is_same<T, $classname$>::value ||\n"
      "    ::std::is_integral<T>::value,\n"
      "    \"Incorrect type passed to function $classname$_Name.\");\n");
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "  return ::$proto_ns$::internal::NameOfEnum(\n"
        "    $classname$_descriptor(), enum_t_value);\n");
  } else {
    format(
        "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n");
  }
  format("}\n");

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "inline bool $classname$_Parse(\n"
        "    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* "
        "value) "
        "{\n"
        "  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n"
        "    $classname$_descriptor(), name, value);\n"
        "}\n");
  } else {
    format(
        "bool $classname$_Parse(\n"
        "    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, $classname$* "
        "value);\n");
  }
}